

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestNoTailForwarder::hold(TestNoTailForwarder *this,HoldContext context)

{
  Client *this_00;
  long lVar1;
  bool bVar2;
  byte extraout_AL;
  byte extraout_AL_00;
  undefined8 *puVar3;
  Coroutine<void> *this_01;
  Client *__n;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *promise;
  Client *cap;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *promise_00;
  Client *__return_storage_ptr__;
  long *plVar4;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  *__return_storage_ptr___00;
  Maybe<capnp::MessageSize> *sizeHint;
  Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *__return_storage_ptr___01;
  PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
  *__return_storage_ptr___02;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  *this_02;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  *__return_storage_ptr___03;
  Maybe<capnp::MessageSize> *sizeHint_00;
  PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
  *__return_storage_ptr___04;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  *this_03;
  TestNoTailForwarder *in_RDX;
  void *__buf;
  void *__buf_00;
  int __flags;
  void *pvVar5;
  undefined4 in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b4;
  Client local_5e0;
  Client local_5c8 [26];
  Client local_348 [5];
  Reader local_2c8 [14];
  CallContextHook *local_20;
  TestNoTailForwarder *this_local;
  HoldContext context_local;
  
  local_20 = context.hook;
  this_local = in_RDX;
  context_local.hook = (CallContextHook *)this;
  puVar3 = (undefined8 *)operator_new(0x808);
  *puVar3 = hold;
  puVar3[1] = hold;
  __return_storage_ptr__ = (Client *)(puVar3 + 0xf2);
  plVar4 = puVar3 + 0xfd;
  __return_storage_ptr___00 =
       (Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
        *)(puVar3 + 0xd5);
  sizeHint = (Maybe<capnp::MessageSize> *)(puVar3 + 0xf5);
  __return_storage_ptr___01 =
       (Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *)(puVar3 + 0xc5);
  __return_storage_ptr___02 =
       (PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_> *)
       (puVar3 + 0x47);
  this_02 = (Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
             *)(puVar3 + 0xe3);
  __return_storage_ptr___03 =
       (Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
        *)(puVar3 + 0xdc);
  sizeHint_00 = (Maybe<capnp::MessageSize> *)(puVar3 + 0xf8);
  __return_storage_ptr___04 =
       (PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *)
       (puVar3 + 0x86);
  this_03 = (Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
             *)(puVar3 + 0xe9);
  this_01 = (Coroutine<void> *)(puVar3 + 2);
  puVar3[0xff] = context.hook;
  ((CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
    *)(puVar3 + 0xfb))->hook = (CallContextHook *)this_local;
  __flags = 0x15;
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)(puVar3 + 0xef),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
             ,"hold",0x854);
  pvVar5 = (void *)puVar3[0xf1];
  kj::_::Coroutine<void>::Coroutine(this_01,*(SourceLocation *)(puVar3 + 0xef));
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_01);
  bVar2 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar3 + 0x805));
  if (bVar2) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar3 + 0x805));
    CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
    ::getParams(local_2c8,
                (CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
                 *)(puVar3 + 0xfb));
    capnproto_test::capnp::test::TestMoreStuff::HoldParams::Reader::getCap
              (__return_storage_ptr__,local_2c8);
    __n = kj::_::readMaybe<capnproto_test::capnp::test::TestMoreStuff::Client>
                    ((Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)
                     (puVar3[0xff] + 0x20));
    *plVar4 = (long)__n;
    if (*plVar4 != 0) {
      __n = (Client *)*plVar4;
      puVar3[0xfe] = __n;
      this_00 = (Client *)puVar3[0xfe];
      kj::Maybe<capnp::MessageSize>::Maybe(sizeHint);
      capnproto_test::capnp::test::TestMoreStuff::Client::echoRequest
                (__return_storage_ptr___00,this_00,sizeHint);
      kj::Maybe<capnp::MessageSize>::~Maybe(sizeHint);
      Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>
                (local_348,
                 (Client *)
                 ((long)&__return_storage_ptr__->_vptr_Client +
                 (long)__return_storage_ptr__->_vptr_Client[-3]));
      capnproto_test::capnp::test::TestMoreStuff::EchoParams::Builder::setCap
                ((Builder *)__return_storage_ptr___00,local_348);
      capnproto_test::capnp::test::TestCallOrder::Client::~Client(local_348);
      Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
      ::send(this_02,(int)__return_storage_ptr___00,__buf,(size_t)__n,__flags);
      promise = kj::_::Coroutine<void>::
                await_transform<capnp::RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults>>
                          (this_01,(RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults>
                                    *)this_02);
      co_await<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>>
                (__return_storage_ptr___02,
                 &promise->
                  super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
                );
      bVar2 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___02);
      if (!bVar2) {
        *(undefined1 *)((long)puVar3 + 0x804) = 1;
        _GLOBAL__N_1::TestNoTailForwarder::hold
                  ((void *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),pvVar5);
        if ((extraout_AL & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      kj::_::
      PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>::
      await_resume(__return_storage_ptr___01,__return_storage_ptr___02);
      kj::_::
      PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>::
      ~PromiseAwaiter(__return_storage_ptr___02);
      RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults>::~RemotePromise
                ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *)this_02);
      capnproto_test::capnp::test::TestMoreStuff::EchoResults::Reader::getCap
                (&local_5e0,(Reader *)__return_storage_ptr___01);
      Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>
                (local_5c8,(Client *)(local_5e0._vptr_Client[-3] + (long)&local_5e0._vptr_Client));
      capnproto_test::capnp::test::TestInterface::Client::operator=
                (__return_storage_ptr__,local_5c8);
      capnproto_test::capnp::test::TestInterface::Client::~Client(local_5c8);
      capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_5e0);
      Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>::~Response
                (__return_storage_ptr___01);
      Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
      ::~Request(__return_storage_ptr___00);
    }
    lVar1 = puVar3[0xff];
    kj::Maybe<capnp::MessageSize>::Maybe(sizeHint_00);
    capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
              (__return_storage_ptr___03,(Client *)(lVar1 + 8),sizeHint_00);
    kj::Maybe<capnp::MessageSize>::~Maybe(sizeHint_00);
    cap = kj::mv<capnproto_test::capnp::test::TestInterface::Client>(__return_storage_ptr__);
    capnproto_test::capnp::test::TestMoreStuff::HoldParams::Builder::setCap
              ((Builder *)__return_storage_ptr___03,cap);
    Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
    ::send(this_03,(int)__return_storage_ptr___03,__buf_00,(size_t)__n,__flags);
    promise_00 = kj::_::Coroutine<void>::
                 await_transform<capnp::RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults>>
                           (this_01,(RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults>
                                     *)this_03);
    co_await<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>>
              (__return_storage_ptr___04,
               &promise_00->
                super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
              );
    bVar2 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr___04);
    if (!bVar2) {
      *(undefined1 *)((long)puVar3 + 0x804) = 2;
      _GLOBAL__N_1::TestNoTailForwarder::hold
                ((void *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),pvVar5);
      if ((extraout_AL_00 & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
    ::await_resume((Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)
                   (puVar3 + 0xcd),__return_storage_ptr___04);
    Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::~Response
              ((Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)(puVar3 + 0xcd))
    ;
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
    ::~PromiseAwaiter(__return_storage_ptr___04);
    RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::~RemotePromise
              ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)this_03);
    Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
    ::~Request(__return_storage_ptr___03);
    capnproto_test::capnp::test::TestInterface::Client::~Client(__return_storage_ptr__);
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_01);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_01);
    bVar2 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x806));
    if (bVar2) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x806));
      kj::_::Coroutine<void>::~Coroutine(this_01);
      if (puVar3 != (undefined8 *)0x0) {
        operator_delete(puVar3,0x808);
      }
    }
    else {
      *puVar3 = 0;
      *(undefined1 *)((long)puVar3 + 0x804) = 3;
      _GLOBAL__N_1::TestNoTailForwarder::hold
                ((void *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),pvVar5);
    }
  }
  else {
    *(undefined1 *)((long)puVar3 + 0x804) = 0;
    _GLOBAL__N_1::TestNoTailForwarder::hold
              ((void *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),pvVar5);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> hold(HoldContext context) override {
    auto cap = context.getParams().getCap();

    // If we have a holdBouncer, bounce the capability through it first before forwarding on.
    KJ_IF_SOME(hb, holdBouncer) {
      auto req = hb.echoRequest();

      // HACK: echo() just reflects the cap back, but it was written to expect TestCallOrder
      //   specifically. We'll just pretend that's what we have, it doesn't matter.
      // TODO(cleanup): Change echo() to take `Capability` or maybe even be a generic.
      req.setCap(cap.castAs<test::TestCallOrder>());
      auto resp = co_await req.send();
      cap = resp.getCap().castAs<test::TestInterface>();
    }

    auto req = next.holdRequest();
    req.setCap(kj::mv(cap));
    co_await req.send();

    // (hold() has no results)
  }